

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmCommonTargetGenerator::ComputeTargetCompilePDB
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this,string *config)

{
  TargetType TVar1;
  uint uVar2;
  ulong uVar3;
  string *psVar4;
  string local_78;
  string local_58;
  undefined1 local_21;
  string *local_20;
  string *config_local;
  cmCommonTargetGenerator *this_local;
  string *compilePdbPath;
  
  local_21 = 0;
  local_20 = config;
  config_local = (string *)this;
  this_local = (cmCommonTargetGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  TVar1 = cmGeneratorTarget::GetType(this->GeneratorTarget);
  if ((int)TVar1 < 5) {
    cmGeneratorTarget::GetCompilePDBPath(&local_58,this->GeneratorTarget,local_20);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_78,this->GeneratorTarget);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      uVar2 = (*(this->GlobalCommonGenerator->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x26]
              )();
      if ((uVar2 & 1) != 0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_20);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
      TVar1 = cmGeneratorTarget::GetType(this->GeneratorTarget);
      if (TVar1 == STATIC_LIBRARY) {
        psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar4);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".pdb");
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::ComputeTargetCompilePDB(
  const std::string& config) const
{
  std::string compilePdbPath;
  if (this->GeneratorTarget->GetType() > cmStateEnums::OBJECT_LIBRARY) {
    return compilePdbPath;
  }

  compilePdbPath = this->GeneratorTarget->GetCompilePDBPath(config);
  if (compilePdbPath.empty()) {
    // Match VS default: `$(IntDir)vc$(PlatformToolsetVersion).pdb`.
    // A trailing slash tells the toolchain to add its default file name.
    compilePdbPath = this->GeneratorTarget->GetSupportDirectory();
    if (this->GlobalCommonGenerator->IsMultiConfig()) {
      compilePdbPath += "/";
      compilePdbPath += config;
    }
    compilePdbPath += "/";
    if (this->GeneratorTarget->GetType() == cmStateEnums::STATIC_LIBRARY) {
      // Match VS default for static libs: `$(IntDir)$(ProjectName).pdb`.
      compilePdbPath += this->GeneratorTarget->GetName();
      compilePdbPath += ".pdb";
    }
  }

  return compilePdbPath;
}